

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

double * __thiscall
google::protobuf::Map<long,_double>::at<long>(Map<long,_double> *this,key_arg<long> *key)

{
  bool bVar1;
  LogMessage *pLVar2;
  const_pointer pvVar3;
  LogFinisher local_95 [20];
  byte local_81;
  LogMessage local_80;
  const_iterator local_48;
  undefined1 local_30 [8];
  const_iterator it;
  key_arg<long> *key_local;
  Map<long,_double> *this_local;
  
  it.it_.bucket_index_ = (size_type)key;
  find<long>((const_iterator *)local_30,this,key);
  end(&local_48,this);
  bVar1 = protobuf::operator!=((const_iterator *)local_30,&local_48);
  local_81 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x4cb);
    local_81 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_80,"CHECK failed: it != end(): ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"key not found: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,*(long *)it.it_.bucket_index_);
    internal::LogFinisher::operator=(local_95,pLVar2);
  }
  if ((local_81 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_80);
  }
  pvVar3 = const_iterator::operator->((const_iterator *)local_30);
  return (double *)(pvVar3 + 8);
}

Assistant:

const T& at(const key_arg<K>& key) const {
    const_iterator it = find(key);
    GOOGLE_CHECK(it != end()) << "key not found: " << static_cast<Key>(key);
    return it->second;
  }